

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textures.c
# Opt level: O0

void ImageResizeCanvas(Image *image,int newWidth,int newHeight,int offsetX,int offsetY,Color fill)

{
  int iVar1;
  void *pvVar2;
  int local_58;
  int local_54;
  int y;
  int dstOffsetSize;
  uchar *resizedData;
  float local_40;
  int bytesPerPixel;
  Vector2 dstPos;
  Rectangle srcRec;
  int offsetY_local;
  int offsetX_local;
  int newHeight_local;
  int newWidth_local;
  Image *image_local;
  Color fill_local;
  
  if (((image->data != (void *)0x0) && (image->width != 0)) && (image->height != 0)) {
    if (1 < image->mipmaps) {
      TraceLog(4,"Image manipulation only applied to base mipmap level");
    }
    if (image->format < 0xb) {
      if ((newWidth != image->width) || (newHeight != image->height)) {
        dstPos.x = 0.0;
        dstPos.y = 0.0;
        srcRec.x = (float)image->width;
        srcRec.y = (float)image->height;
        local_40 = (float)offsetX;
        bytesPerPixel = (int)(float)offsetY;
        if (offsetX < 0) {
          dstPos.x = (float)-offsetX;
          srcRec.x = (float)offsetX + srcRec.x;
          local_40 = 0.0;
        }
        else if (newWidth < offsetX + image->width) {
          srcRec.x = (float)(newWidth - offsetX);
        }
        if (offsetY < 0) {
          dstPos.y = (float)-offsetY;
          srcRec.y = (float)offsetY + srcRec.y;
          bytesPerPixel = 0;
        }
        else if (newHeight < offsetY + image->height) {
          srcRec.y = (float)(newHeight - offsetY);
        }
        if ((float)newWidth < srcRec.x) {
          srcRec.x = (float)newWidth;
        }
        if ((float)newHeight < srcRec.y) {
          srcRec.y = (float)newHeight;
        }
        iVar1 = GetPixelDataSize(1,1,image->format);
        pvVar2 = calloc((long)(newWidth * newHeight * iVar1),1);
        local_54 = ((int)(float)bytesPerPixel * newWidth + (int)local_40) * iVar1;
        for (local_58 = 0; local_58 < (int)srcRec.y; local_58 = local_58 + 1) {
          memcpy((void *)((long)pvVar2 + (long)local_54),
                 (void *)((long)image->data +
                         (long)(((local_58 + (int)dstPos.y) * image->width + (int)dstPos.x) * iVar1)
                         ),(long)((int)srcRec.x * iVar1));
          local_54 = newWidth * iVar1 + local_54;
        }
        free(image->data);
        image->data = pvVar2;
        image->width = newWidth;
        image->height = newHeight;
      }
    }
    else {
      TraceLog(4,"Image manipulation not supported for compressed formats");
    }
  }
  return;
}

Assistant:

void ImageResizeCanvas(Image *image, int newWidth, int newHeight, int offsetX, int offsetY, Color fill)
{
    // Security check to avoid program crash
    if ((image->data == NULL) || (image->width == 0) || (image->height == 0)) return;

    if (image->mipmaps > 1) TRACELOG(LOG_WARNING, "Image manipulation only applied to base mipmap level");
    if (image->format >= PIXELFORMAT_COMPRESSED_DXT1_RGB) TRACELOG(LOG_WARNING, "Image manipulation not supported for compressed formats");
    else if ((newWidth != image->width) || (newHeight != image->height))
    {
        Rectangle srcRec = { 0, 0, (float)image->width, (float)image->height };
        Vector2 dstPos = { (float)offsetX, (float)offsetY };

        if (offsetX < 0)
        {
            srcRec.x = (float)-offsetX;
            srcRec.width += (float)offsetX;
            dstPos.x = 0;
        }
        else if ((offsetX + image->width) > newWidth) srcRec.width = (float)(newWidth - offsetX);

        if (offsetY < 0)
        {
            srcRec.y = (float)-offsetY;
            srcRec.height += (float)offsetY;
            dstPos.y = 0;
        }
        else if ((offsetY + image->height) > newHeight) srcRec.height = (float)(newHeight - offsetY);

        if (newWidth < srcRec.width) srcRec.width = (float)newWidth;
        if (newHeight < srcRec.height) srcRec.height = (float)newHeight;

        int bytesPerPixel = GetPixelDataSize(1, 1, image->format);
        unsigned char *resizedData = (unsigned char *)RL_CALLOC(newWidth*newHeight*bytesPerPixel, 1);

        // TODO: Fill resizedData with fill color (must be formatted to image->format)

        int dstOffsetSize = ((int)dstPos.y*newWidth + (int)dstPos.x)*bytesPerPixel;

        for (int y = 0; y < (int)srcRec.height; y++)
        {
            memcpy(resizedData + dstOffsetSize, ((unsigned char *)image->data) + ((y + (int)srcRec.y)*image->width + (int)srcRec.x)*bytesPerPixel, (int)srcRec.width*bytesPerPixel);
            dstOffsetSize += (newWidth*bytesPerPixel);
        }

        RL_FREE(image->data);
        image->data = resizedData;
        image->width = newWidth;
        image->height = newHeight;
    }
}